

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

int io_file_readline(lua_State *L,FILE *fp,MSize chop)

{
  TValue *pTVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  GCstr *pGVar5;
  ulong uVar6;
  MSize sz;
  uint uVar7;
  uint local_40;
  
  sz = 0x2000;
  __s = lj_buf_tmp(L,0x2000);
  pcVar2 = fgets(__s,0x2000,(FILE *)fp);
  if (pcVar2 == (char *)0x0) {
    uVar7 = 0;
    local_40 = 0;
  }
  else {
    local_40 = 0;
    uVar7 = 0;
    pcVar2 = __s;
    do {
      sVar3 = strlen(pcVar2);
      uVar7 = (int)sVar3 + uVar7;
      local_40 = local_40 | uVar7;
      if ((uVar7 != 0) && (__s[uVar7 - 1] == '\n')) {
        uVar7 = uVar7 - chop;
        break;
      }
      sz = sz << (sz - 0x40 <= uVar7);
      __s = lj_buf_tmp(L,sz);
      pcVar2 = __s + uVar7;
      pcVar4 = fgets(pcVar2,sz - uVar7,(FILE *)fp);
    } while (pcVar4 != (char *)0x0);
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pGVar5 = lj_str_new(L,__s,(ulong)uVar7);
  (pTVar1->u32).lo = (uint32_t)pGVar5;
  (pTVar1->field_2).it = 0xfffffffb;
  uVar6 = (ulong)(L->glref).ptr32;
  if (*(uint *)(uVar6 + 0x54) <= *(uint *)(uVar6 + 0x50)) {
    lj_gc_step(L);
  }
  return local_40;
}

Assistant:

static int io_file_readline(lua_State *L, FILE *fp, MSize chop)
{
  MSize m = LUAL_BUFFERSIZE, n = 0, ok = 0;
  char *buf;
  for (;;) {
    buf = lj_buf_tmp(L, m);
    if (fgets(buf+n, m-n, fp) == NULL) break;
    n += (MSize)strlen(buf+n);
    ok |= n;
    if (n && buf[n-1] == '\n') { n -= chop; break; }
    if (n >= m - 64) m += m;
  }
  setstrV(L, L->top++, lj_str_new(L, buf, (size_t)n));
  lj_gc_check(L);
  return (int)ok;
}